

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>::
double_writer::operator()(double_writer *this,counting_iterator<char> *it)

{
  char cVar1;
  long lVar2;
  long lVar3;
  size_t sVar4;
  char *pcVar5;
  
  if (this[8] != (double_writer)0x0) {
    it->count_ = it->count_ + 1;
    *(long *)this = *(long *)this + -1;
  }
  lVar2 = *(long *)(*(long *)(this + 0x10) + 0x10);
  sVar4 = it->count_;
  if (lVar2 < 1) {
    pcVar5 = &it->blackhole_;
  }
  else {
    lVar3 = *(long *)(*(long *)(this + 0x10) + 8);
    pcVar5 = (char *)(lVar2 + lVar3 + -1);
    sVar4 = (sVar4 - lVar3) + lVar3 + lVar2;
  }
  cVar1 = *pcVar5;
  it->count_ = sVar4;
  it->blackhole_ = cVar1;
  return;
}

Assistant:

void operator()(It &&it) {
      if (sign) {
        *it++ = static_cast<char_type>(sign);
        --n;
      }
      it = internal::copy_str<char_type>(buffer.begin(), buffer.end(), it);
    }